

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003cbdd0 == '\x01') {
    DAT_003cbdd0 = '\0';
    (*(code *)*_ItemSimilarityRecommender_ConnectedItem_default_instance_)();
  }
  if (DAT_003cbe18 == '\x01') {
    DAT_003cbe18 = '\0';
    (*(code *)*_ItemSimilarityRecommender_SimilarItems_default_instance_)();
  }
  if (DAT_003cbe90 == '\x01') {
    DAT_003cbe90 = 0;
    (*(code *)*_ItemSimilarityRecommender_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _ItemSimilarityRecommender_ConnectedItem_default_instance_.Shutdown();
  _ItemSimilarityRecommender_SimilarItems_default_instance_.Shutdown();
  _ItemSimilarityRecommender_default_instance_.Shutdown();
}